

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O0

bool __thiscall ASDCP::KLVPacket::HasUL(KLVPacket *this,byte_t *ul)

{
  bool bVar1;
  UL local_90;
  UL local_60;
  UL local_40;
  byte_t *local_20;
  byte_t *ul_local;
  KLVPacket *this_local;
  
  local_20 = ul;
  ul_local = (byte_t *)this;
  if (this->m_KeyStart == (byte_t *)0x0) {
    bVar1 = Kumu::Identifier<16U>::HasValue(&(this->m_UL).super_Identifier<16U>);
    if (bVar1) {
      UL::UL(&local_90,local_20);
      this_local._7_1_ = UL::operator==(&local_90,&this->m_UL);
      UL::~UL(&local_90);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    UL::UL(&local_40,ul);
    UL::UL(&local_60,this->m_KeyStart);
    this_local._7_1_ = UL::operator==(&local_40,&local_60);
    UL::~UL(&local_60);
    UL::~UL(&local_40);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
ASDCP::KLVPacket::HasUL(const byte_t* ul)
{
  if ( m_KeyStart != 0 )
    {
      return UL(ul) == UL(m_KeyStart);
    }

  if ( m_UL.HasValue() )
    {
      return UL(ul) == m_UL;
    }

  return false;
}